

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall CaDiCaL::Solver::message(Solver *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  External *this_00;
  char *in_RCX;
  char *fmt;
  int iVar6;
  char *fmt_00;
  Internal *this_01;
  Internal *this_02;
  Internal *pIVar7;
  __va_list_tag _Stack_1d8;
  undefined1 auStack_1b8 [192];
  Internal *pIStack_f8;
  undefined8 uStack_f0;
  
  if (this->_state == DELETING) {
    return;
  }
  iVar6 = 0x9490ea;
  this_01 = (Internal *)this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::message()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    message();
  }
  else {
    this_01 = this->internal;
    if (this_01 != (Internal *)0x0) {
      Internal::message(this_01);
      return;
    }
  }
  message();
  iVar1._0_1_ = this_01->unsat;
  iVar1._1_1_ = this_01->iterating;
  iVar1._2_1_ = this_01->localsearching;
  iVar1._3_1_ = this_01->lookingahead;
  if (iVar1 == 0x80) {
    return;
  }
  fmt_00 = "void CaDiCaL::Solver::verbose(int, const char *, ...)";
  pIStack_f8 = (Internal *)0x860c59;
  this_02 = this_01;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_01,"void CaDiCaL::Solver::verbose(int, const char *, ...)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar2._0_1_ = this_01->external_prop_is_lazy;
  lVar2._1_1_ = this_01->forced_backt_allowed;
  lVar2._2_1_ = this_01->private_steps;
  lVar2._3_1_ = this_01->rephased;
  lVar2._4_4_ = *(undefined4 *)&this_01->field_0x14;
  if (lVar2 == 0) {
    pIStack_f8 = (Internal *)0x860cb2;
    verbose();
  }
  else {
    lVar3._0_1_ = this_01->preprocessing;
    lVar3._1_1_ = this_01->protected_reasons;
    lVar3._2_1_ = this_01->force_saved_phase;
    lVar3._3_1_ = this_01->searching_lucky_phases;
    lVar3._4_1_ = this_01->stable;
    lVar3._5_1_ = this_01->reported;
    lVar3._6_1_ = this_01->external_prop;
    lVar3._7_1_ = this_01->did_external_prop;
    if (lVar3 != 0) {
      if ((this_01->unsat & 0x7eU) != 0) {
        uStack_f0._0_4_ = 0x18;
        uStack_f0._4_4_ = 0x30;
        pIStack_f8 = (Internal *)0x860ca1;
        Internal::vverbose(*(Internal **)&this_01->preprocessing,iVar6,fmt,(va_list *)&uStack_f0);
        return;
      }
      goto LAB_00860cb7;
    }
  }
  pIStack_f8 = (Internal *)0x860cb7;
  verbose();
LAB_00860cb7:
  pIStack_f8 = (Internal *)error;
  verbose();
  iVar6._0_1_ = this_02->unsat;
  iVar6._1_1_ = this_02->iterating;
  iVar6._2_1_ = this_02->localsearching;
  iVar6._3_1_ = this_02->lookingahead;
  if (iVar6 == 0x80) {
    return;
  }
  pIVar7 = this_02;
  pIStack_f8 = this_01;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_02,"void CaDiCaL::Solver::error(const char *, ...)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar4._0_1_ = this_02->external_prop_is_lazy;
  lVar4._1_1_ = this_02->forced_backt_allowed;
  lVar4._2_1_ = this_02->private_steps;
  lVar4._3_1_ = this_02->rephased;
  lVar4._4_4_ = *(undefined4 *)&this_02->field_0x14;
  if (lVar4 == 0) {
    error();
  }
  else {
    lVar5._0_1_ = this_02->preprocessing;
    lVar5._1_1_ = this_02->protected_reasons;
    lVar5._2_1_ = this_02->force_saved_phase;
    lVar5._3_1_ = this_02->searching_lucky_phases;
    lVar5._4_1_ = this_02->stable;
    lVar5._5_1_ = this_02->reported;
    lVar5._6_1_ = this_02->external_prop;
    lVar5._7_1_ = this_02->did_external_prop;
    if (lVar5 != 0) {
      _Stack_1d8.reg_save_area = auStack_1b8;
      _Stack_1d8.overflow_arg_area = &stack0xffffffffffffff18;
      _Stack_1d8.gp_offset = 0x10;
      _Stack_1d8.fp_offset = 0x30;
      Internal::verror(*(Internal **)&this_02->preprocessing,fmt_00,(va_list *)&_Stack_1d8);
      return;
    }
  }
  error();
  this_00 = *(External **)pIVar7;
  if (this_00 == (External *)0x0) {
    return;
  }
  External::~External(this_00);
  operator_delete(this_00,0x238);
  return;
}

Assistant:

void Solver::message () {
  if (state () == DELETING)
    return;
  REQUIRE_INITIALIZED ();
#ifndef QUIET
  internal->message ();
#endif
}